

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_ExcludesFlags_Test::TestBody(TApp_ExcludesFlags_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  Option *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  AssertHelper local_258;
  Message local_250 [2];
  ExcludesError *anon_var_0_1;
  char *pcStack_238;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200 [32];
  iterator local_1e0;
  size_type local_1d8;
  AssertHelper local_1d0;
  Message local_1c8 [2];
  ExcludesError *anon_var_0;
  char *pcStack_1b0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178 [32];
  iterator local_158;
  size_type local_150;
  undefined1 local_142;
  allocator local_141 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  iterator local_118;
  size_type local_110;
  undefined1 local_102;
  allocator local_101 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  iterator local_d8;
  size_type local_d0;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *opt;
  TApp_ExcludesFlags_Test *this_local;
  
  opt = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"-s,--string",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--nostr",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_98,&local_c0);
  CLI::Option::excludes(pOVar2,local_18);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_102 = '\x01';
  local_101._1_8_ = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"-s",local_101);
  local_102 = '\0';
  local_d8 = &local_f8;
  local_d0 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = local_d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
  do {
    local_2b8 = local_2b8 + -1;
    std::__cxx11::string::~string((string *)local_2b8);
  } while (local_2b8 != &local_f8);
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_142 = '\x01';
  local_141._1_8_ = &local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"--nostr",local_141);
  local_142 = '\0';
  local_118 = &local_138;
  local_110 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_118;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
  do {
    local_2e0 = local_2e0 + -1;
    std::__cxx11::string::~string((string *)local_2e0);
  } while (local_2e0 != &local_138);
  std::allocator<char>::~allocator((allocator<char> *)local_141);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"--nostr",(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"-s",(allocator *)((long)&gtest_msg.value + 6));
  gtest_msg.value._5_1_ = 0;
  local_158 = &local_198;
  local_150 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_158;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158;
  do {
    local_318 = local_318 + -1;
    std::__cxx11::string::~string((string *)local_318);
  } while (local_318 != &local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe50);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00146051;
    pcStack_1b0 = 
    "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_1c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3fc,pcStack_1b0);
  testing::internal::AssertHelper::operator=(&local_1d0,local_1c8);
  testing::internal::AssertHelper::~AssertHelper(&local_1d0);
  testing::Message::~Message(local_1c8);
LAB_00146051:
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_220,"--string",(allocator *)((long)&gtest_msg_1.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"--nostr",(allocator *)((long)&gtest_msg_1.value + 6));
  gtest_msg_1.value._5_1_ = 0;
  local_1e0 = &local_220;
  local_1d8 = 2;
  __l._M_len = 2;
  __l._M_array = local_1e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0;
  do {
    local_3d0 = local_3d0 + -1;
    std::__cxx11::string::~string((string *)local_3d0);
  } while (local_3d0 != &local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdc8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdc8);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) {
      return;
    }
    pcStack_238 = 
    "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_250);
  testing::internal::AssertHelper::AssertHelper
            (&local_258,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x400,pcStack_238);
  testing::internal::AssertHelper::operator=(&local_258,local_250);
  testing::internal::AssertHelper::~AssertHelper(&local_258);
  testing::Message::~Message(local_250);
  return;
}

Assistant:

TEST_F(TApp, ExcludesFlags) {
    CLI::Option *opt = app.add_flag("-s,--string");
    app.add_flag("--nostr")->excludes(opt);

    run();

    app.reset();
    args = {"-s"};
    run();

    app.reset();
    args = {"--nostr"};
    run();

    app.reset();
    args = {"--nostr", "-s"};
    EXPECT_THROW(run(), CLI::ExcludesError);

    app.reset();
    args = {"--string", "--nostr"};
    EXPECT_THROW(run(), CLI::ExcludesError);
}